

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft.cpp
# Opt level: O0

void makeipt(int nw,int *ip)

{
  int iVar1;
  int iVar2;
  int q;
  int p;
  int m2;
  int m;
  int l;
  int j;
  int *ip_local;
  int nw_local;
  
  ip[2] = 0;
  ip[3] = 0x10;
  p = 2;
  for (m2 = nw; 0x20 < m2; m2 = m2 >> 2) {
    iVar2 = p * 2;
    for (m = p; m < iVar2; m = m + 1) {
      iVar1 = ip[m];
      ip[p + m] = iVar1 * 4;
      ip[iVar2 + m] = iVar1 * 4 + p * 0x10;
    }
    p = iVar2;
  }
  return;
}

Assistant:

void makeipt(int nw, int *ip) {
  int j, l, m, m2, p, q;

  ip[2] = 0;
  ip[3] = 16;
  m = 2;
  for (l = nw; l > 32; l >>= 2) {
    m2 = m << 1;
    q = m2 << 3;
    for (j = m; j < m2; j++) {
      p = ip[j] << 2;
      ip[m + j] = p;
      ip[m2 + j] = p + q;
    }
    m = m2;
  }
}